

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

bool_t wwIsW_fast(word *a,size_t n,word w)

{
  uint uVar1;
  long lVar2;
  word *pwVar3;
  bool bVar4;
  
  if (n == 0) {
    uVar1 = (uint)(w == 0);
  }
  else {
    lVar2 = n - 1;
    uVar1 = 0;
    pwVar3 = a;
    while (*pwVar3 == w) {
      bVar4 = lVar2 == 0;
      lVar2 = lVar2 + -1;
      if (bVar4) {
        return 1;
      }
      n = n - 1;
      w = 0;
      pwVar3 = a + n;
    }
  }
  return uVar1;
}

Assistant:

bool_t FAST(wwIsW)(const word a[], size_t n, register word w)
{
	register bool_t ret;
	ASSERT(wwIsValid(a, n));
	if (n == 0)
		ret = (w == 0);
	else
	{
		ret = (a[0] == w);
		while (ret && --n)
			ret = (a[n] == 0);
	}
	w = 0;
	return ret;
}